

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Matchers::StdString::EndsWithMatcher::EndsWithMatcher
          (EndsWithMatcher *this,CasedString *comparator)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ends with","");
  StringMatcherBase::StringMatcherBase(&this->super_StringMatcherBase,&local_40,comparator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_StringMatcherBase).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_001be378;
  (this->super_StringMatcherBase).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_001be3a8;
  return;
}

Assistant:

EndsWithMatcher::EndsWithMatcher( CasedString const& comparator ) : StringMatcherBase( "ends with", comparator ) {}